

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

GLchar * gl4cts::EnhancedLayouts::Utils::Shader::GetStageName(STAGES stage)

{
  TestError *this;
  char *local_18;
  GLchar *result;
  STAGES stage_local;
  
  switch(stage) {
  case COMPUTE:
    local_18 = "compute";
    break;
  case VERTEX:
    local_18 = "vertex";
    break;
  case TESS_CTRL:
    local_18 = "tesselation control";
    break;
  case TESS_EVAL:
    local_18 = "tesselation evaluation";
    break;
  case GEOMETRY:
    local_18 = "geomtery";
    break;
  case FRAGMENT:
    local_18 = "fragment";
    break;
  default:
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
               ,0x977);
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return local_18;
}

Assistant:

const glw::GLchar* Shader::GetStageName(STAGES stage)
{
	const GLchar* result = 0;

	switch (stage)
	{
	case COMPUTE:
		result = "compute";
		break;
	case VERTEX:
		result = "vertex";
		break;
	case TESS_CTRL:
		result = "tesselation control";
		break;
	case TESS_EVAL:
		result = "tesselation evaluation";
		break;
	case GEOMETRY:
		result = "geomtery";
		break;
	case FRAGMENT:
		result = "fragment";
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	return result;
}